

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void decoder_model_process_frame(AV1_COMP *cpi,size_t coded_bits,DECODER_MODEL *decoder_model)

{
  size_t sVar1;
  double dVar2;
  int iVar3;
  DFG_INTERVAL_QUEUE *pDVar4;
  long lVar5;
  int iVar6;
  DECODER_MODEL *in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double this_display_rate;
  double previous_presentation_time;
  int previous_display_samples;
  double presentation_time;
  FRAME_BUFFER *this_buffer_1;
  FRAME_BUFFER *this_buffer;
  int i;
  CurrentFrame *current_frame;
  int cfbi;
  int queue_index;
  double last_bit_arrival_time;
  double first_bit_arrival_time;
  DFG_INTERVAL_QUEUE *queue;
  double latest_arrival_time;
  double buffer_delay;
  double this_decode_rate;
  double previous_removal_time;
  int previous_decode_samples;
  double removal_time;
  int display_idx;
  int show_frame;
  int show_existing_frame;
  int luma_pic_size;
  AV1_COMMON *cm;
  FRAME_BUFFER *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  uint7 in_stack_ffffffffffffff20;
  bool bVar10;
  double local_d8;
  double local_d0;
  bool local_c1;
  int local_8c;
  int local_30;
  
  if ((in_RDX != (DECODER_MODEL *)0x0) && (in_RDX->status == '\0')) {
    iVar3 = *(int *)(in_RDI + 0x3bfc8) * *(int *)(in_RDI + 0x3bfbc);
    iVar6 = *(int *)(in_RDI + 0x3c168);
    local_c1 = *(int *)(in_RDI + 0x3c160) != 0 || iVar6 != 0;
    in_RDX->num_frame = in_RDX->num_frame + 1;
    if (iVar6 == 0) {
      in_RDX->num_decoded_frame = in_RDX->num_decoded_frame + 1;
    }
    if (local_c1) {
      in_RDX->num_shown_frame = in_RDX->num_shown_frame + 1;
    }
    in_RDX->coded_bits = in_RSI + in_RDX->coded_bits;
    if (iVar6 == 0) {
      dVar8 = get_removal_time((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                               SUB84(in_stack_ffffffffffffff18,0),
                               (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                               in_stack_ffffffffffffff08,1.20598163316586e-317);
      if (0.0 <= dVar8) {
        iVar6 = in_RDX->decode_samples;
        dVar7 = in_RDX->removal_time;
        in_RDX->removal_time = dVar8;
        in_RDX->decode_samples = iVar3;
        local_d0 = (double)iVar6 / (dVar8 - dVar7);
        if (local_d0 < in_RDX->max_decode_rate) {
          local_d0 = in_RDX->max_decode_rate;
        }
        in_RDX->max_decode_rate = local_d0;
        local_d8 = dVar8 - (double)(in_RDX->encoder_buffer_delay + in_RDX->decoder_buffer_delay) /
                           90000.0;
        if (local_d8 < in_RDX->last_bit_arrival_time) {
          local_d8 = in_RDX->last_bit_arrival_time;
        }
        in_RDX->first_bit_arrival_time = local_d8;
        sVar1 = in_RDX->coded_bits;
        auVar9._8_4_ = (int)(sVar1 >> 0x20);
        auVar9._0_8_ = sVar1;
        auVar9._12_4_ = 0x45300000;
        in_RDX->last_bit_arrival_time =
             in_RDX->first_bit_arrival_time +
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) / in_RDX->bit_rate;
        if ((in_RDX->last_bit_arrival_time <= dVar8) || ((in_RDX->is_low_delay_mode & 1U) != 0)) {
          in_RDX->coded_bits = 0;
          pDVar4 = &in_RDX->dfg_interval_queue;
          dVar7 = in_RDX->first_bit_arrival_time;
          dVar2 = in_RDX->last_bit_arrival_time;
          while( true ) {
            bVar10 = false;
            if (pDVar4->buf[pDVar4->head].removal_time <= dVar2) {
              bVar10 = 0 < (in_RDX->dfg_interval_queue).size;
            }
            if (!bVar10) {
              iVar6 = (in_RDX->dfg_interval_queue).size;
              (in_RDX->dfg_interval_queue).size = iVar6 + 1;
              iVar6 = (pDVar4->head + iVar6) % 0x40;
              (in_RDX->dfg_interval_queue).buf[iVar6].first_bit_arrival_time = dVar7;
              pDVar4->buf[iVar6].last_bit_arrival_time = dVar2;
              pDVar4->buf[iVar6].removal_time = dVar8;
              (in_RDX->dfg_interval_queue).total_interval =
                   (dVar2 - dVar7) + (in_RDX->dfg_interval_queue).total_interval;
              if (1.0 < (in_RDX->dfg_interval_queue).total_interval) {
                in_RDX->status = '\x06';
                return;
              }
              release_processed_frames
                        ((DECODER_MODEL *)(ulong)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                        );
              dVar7 = time_to_decode_frame((AV1_COMMON *)(in_RDI + 0x3bf80),in_RDX->decode_rate);
              in_RDX->current_time = dVar8 + dVar7;
              local_30 = get_free_buffer(in_RDX);
              if (local_30 < 0) {
                in_RDX->status = '\x02';
                return;
              }
              in_RDX->frame_buffer_pool[local_30].frame_type =
                   (((AV1_COMMON *)(in_RDI + 0x3bf80))->current_frame).frame_type;
              update_ref_buffers(in_RDX,local_30,*(int *)(in_RDI + 0x3bfa4));
              if ((in_RDX->initial_presentation_delay <= 0.0 &&
                   in_RDX->initial_presentation_delay != 0.0) &&
                 (iVar6 = frames_in_buffer_pool(in_RDX), in_RDX->initial_display_delay + -1 <= iVar6
                 )) {
                in_RDX->initial_presentation_delay = in_RDX->current_time;
                for (local_8c = 0; local_8c < 10; local_8c = local_8c + 1) {
                  lVar5 = (long)local_8c;
                  if (in_RDX->frame_buffer_pool[lVar5].player_ref_count != 0) {
                    dVar8 = get_presentation_time
                                      (in_RDX,in_RDX->frame_buffer_pool[lVar5].display_index);
                    in_RDX->frame_buffer_pool[lVar5].presentation_time = dVar8;
                  }
                }
              }
              goto LAB_00254548;
            }
            if (1.0 < (pDVar4->buf[pDVar4->head].removal_time - dVar7) +
                      (in_RDX->dfg_interval_queue).total_interval) break;
            (in_RDX->dfg_interval_queue).total_interval =
                 (in_RDX->dfg_interval_queue).total_interval -
                 (pDVar4->buf[pDVar4->head].last_bit_arrival_time -
                 (in_RDX->dfg_interval_queue).buf[pDVar4->head].first_bit_arrival_time);
            pDVar4->head = (pDVar4->head + 1) % 0x40;
            (in_RDX->dfg_interval_queue).size = (in_RDX->dfg_interval_queue).size + -1;
          }
          in_RDX->status = '\x06';
        }
        else {
          in_RDX->status = '\x05';
        }
      }
      else {
        in_RDX->status = '\x02';
      }
    }
    else {
      local_30 = in_RDX->vbi[*(int *)(in_RDI + 0x9d1f0)];
      if (local_30 < 0) {
        in_RDX->status = '\x03';
      }
      else {
        if (in_RDX->frame_buffer_pool[local_30].frame_type == '\0') {
          update_ref_buffers(in_RDX,local_30,0xff);
        }
LAB_00254548:
        if (local_c1) {
          lVar5 = (long)local_30;
          in_RDX->frame_buffer_pool[lVar5].player_ref_count =
               in_RDX->frame_buffer_pool[lVar5].player_ref_count + 1;
          in_RDX->frame_buffer_pool[lVar5].display_index = in_RDX->num_shown_frame;
          dVar8 = get_presentation_time(in_RDX,in_RDX->frame_buffer_pool[lVar5].display_index);
          in_RDX->frame_buffer_pool[lVar5].presentation_time = dVar8;
          if ((dVar8 < 0.0) || (in_RDX->current_time <= dVar8)) {
            iVar6 = in_RDX->display_samples;
            dVar7 = in_RDX->presentation_time;
            in_RDX->display_samples = iVar3;
            in_RDX->presentation_time = dVar8;
            if ((0.0 <= dVar8) && (0.0 <= dVar7)) {
              dVar8 = (double)iVar6 / (dVar8 - dVar7);
              if (dVar8 < in_RDX->max_display_rate) {
                dVar8 = in_RDX->max_display_rate;
              }
              in_RDX->max_display_rate = dVar8;
            }
          }
          else {
            in_RDX->status = '\x04';
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void decoder_model_process_frame(const AV1_COMP *const cpi,
                                        size_t coded_bits,
                                        DECODER_MODEL *const decoder_model) {
  if (!decoder_model || decoder_model->status != DECODER_MODEL_OK) return;

  const AV1_COMMON *const cm = &cpi->common;
  const int luma_pic_size = cm->superres_upscaled_width * cm->height;
  const int show_existing_frame = cm->show_existing_frame;
  const int show_frame = cm->show_frame || show_existing_frame;
  ++decoder_model->num_frame;
  if (!show_existing_frame) ++decoder_model->num_decoded_frame;
  if (show_frame) ++decoder_model->num_shown_frame;
  decoder_model->coded_bits += coded_bits;

  int display_idx = -1;
  if (show_existing_frame) {
    display_idx = decoder_model->vbi[cpi->existing_fb_idx_to_show];
    if (display_idx < 0) {
      decoder_model->status = DECODE_EXISTING_FRAME_BUF_EMPTY;
      return;
    }
    if (decoder_model->frame_buffer_pool[display_idx].frame_type == KEY_FRAME) {
      update_ref_buffers(decoder_model, display_idx, 0xFF);
    }
  } else {
    const double removal_time = get_removal_time(
        decoder_model->mode, decoder_model->num_decoded_frame,
        decoder_model->decoder_buffer_delay, decoder_model->frame_buffer_pool,
        decoder_model->current_time);
    if (removal_time < 0.0) {
      decoder_model->status = DECODE_FRAME_BUF_UNAVAILABLE;
      return;
    }

    const int previous_decode_samples = decoder_model->decode_samples;
    const double previous_removal_time = decoder_model->removal_time;
    assert(previous_removal_time < removal_time);
    decoder_model->removal_time = removal_time;
    decoder_model->decode_samples = luma_pic_size;
    const double this_decode_rate =
        previous_decode_samples / (removal_time - previous_removal_time);
    decoder_model->max_decode_rate =
        AOMMAX(decoder_model->max_decode_rate, this_decode_rate);

    // A frame with show_existing_frame being false indicates the end of a DFG.
    // Update the bits arrival time of this DFG.
    const double buffer_delay = (decoder_model->encoder_buffer_delay +
                                 decoder_model->decoder_buffer_delay) /
                                90000.0;
    const double latest_arrival_time = removal_time - buffer_delay;
    decoder_model->first_bit_arrival_time =
        AOMMAX(decoder_model->last_bit_arrival_time, latest_arrival_time);
    decoder_model->last_bit_arrival_time =
        decoder_model->first_bit_arrival_time +
        (double)decoder_model->coded_bits / decoder_model->bit_rate;
    // Smoothing buffer underflows if the last bit arrives after the removal
    // time.
    if (decoder_model->last_bit_arrival_time > removal_time &&
        !decoder_model->is_low_delay_mode) {
      decoder_model->status = SMOOTHING_BUFFER_UNDERFLOW;
      return;
    }
    // Reset the coded bits for the next DFG.
    decoder_model->coded_bits = 0;

    // Check if the smoothing buffer overflows.
    DFG_INTERVAL_QUEUE *const queue = &decoder_model->dfg_interval_queue;
    if (queue->size >= DFG_INTERVAL_QUEUE_SIZE) {
      assert(0);
    }
    const double first_bit_arrival_time = decoder_model->first_bit_arrival_time;
    const double last_bit_arrival_time = decoder_model->last_bit_arrival_time;
    // Remove the DFGs with removal time earlier than last_bit_arrival_time.
    while (queue->buf[queue->head].removal_time <= last_bit_arrival_time &&
           queue->size > 0) {
      if (queue->buf[queue->head].removal_time - first_bit_arrival_time +
              queue->total_interval >
          1.0) {
        decoder_model->status = SMOOTHING_BUFFER_OVERFLOW;
        return;
      }
      queue->total_interval -= queue->buf[queue->head].last_bit_arrival_time -
                               queue->buf[queue->head].first_bit_arrival_time;
      queue->head = (queue->head + 1) % DFG_INTERVAL_QUEUE_SIZE;
      --queue->size;
    }
    // Push current DFG into the queue.
    const int queue_index =
        (queue->head + queue->size++) % DFG_INTERVAL_QUEUE_SIZE;
    queue->buf[queue_index].first_bit_arrival_time = first_bit_arrival_time;
    queue->buf[queue_index].last_bit_arrival_time = last_bit_arrival_time;
    queue->buf[queue_index].removal_time = removal_time;
    queue->total_interval += last_bit_arrival_time - first_bit_arrival_time;
    // The smoothing buffer can hold at most "bit_rate" bits, which is
    // equivalent to 1 second of total interval.
    if (queue->total_interval > 1.0) {
      decoder_model->status = SMOOTHING_BUFFER_OVERFLOW;
      return;
    }

    release_processed_frames(decoder_model, removal_time);
    decoder_model->current_time =
        removal_time + time_to_decode_frame(cm, decoder_model->decode_rate);

    const int cfbi = get_free_buffer(decoder_model);
    if (cfbi < 0) {
      decoder_model->status = DECODE_FRAME_BUF_UNAVAILABLE;
      return;
    }
    const CurrentFrame *const current_frame = &cm->current_frame;
    decoder_model->frame_buffer_pool[cfbi].frame_type =
        cm->current_frame.frame_type;
    display_idx = cfbi;
    update_ref_buffers(decoder_model, cfbi, current_frame->refresh_frame_flags);

    if (decoder_model->initial_presentation_delay < 0.0) {
      // Display can begin after required number of frames have been buffered.
      if (frames_in_buffer_pool(decoder_model) >=
          decoder_model->initial_display_delay - 1) {
        decoder_model->initial_presentation_delay = decoder_model->current_time;
        // Update presentation time for each shown frame in the frame buffer.
        for (int i = 0; i < BUFFER_POOL_MAX_SIZE; ++i) {
          FRAME_BUFFER *const this_buffer =
              &decoder_model->frame_buffer_pool[i];
          if (this_buffer->player_ref_count == 0) continue;
          assert(this_buffer->display_index >= 0);
          this_buffer->presentation_time =
              get_presentation_time(decoder_model, this_buffer->display_index);
        }
      }
    }
  }

  // Display.
  if (show_frame) {
    assert(display_idx >= 0 && display_idx < BUFFER_POOL_MAX_SIZE);
    FRAME_BUFFER *const this_buffer =
        &decoder_model->frame_buffer_pool[display_idx];
    ++this_buffer->player_ref_count;
    this_buffer->display_index = decoder_model->num_shown_frame;
    const double presentation_time =
        get_presentation_time(decoder_model, this_buffer->display_index);
    this_buffer->presentation_time = presentation_time;
    if (presentation_time >= 0.0 &&
        decoder_model->current_time > presentation_time) {
      decoder_model->status = DISPLAY_FRAME_LATE;
      return;
    }

    const int previous_display_samples = decoder_model->display_samples;
    const double previous_presentation_time = decoder_model->presentation_time;
    decoder_model->display_samples = luma_pic_size;
    decoder_model->presentation_time = presentation_time;
    if (presentation_time >= 0.0 && previous_presentation_time >= 0.0) {
      assert(previous_presentation_time < presentation_time);
      const double this_display_rate =
          previous_display_samples /
          (presentation_time - previous_presentation_time);
      decoder_model->max_display_rate =
          AOMMAX(decoder_model->max_display_rate, this_display_rate);
    }
  }
}